

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lh_record_insert(unqlite_kv_engine *pKv,void *pKey,sxu32 nKeyLen,void *pData,
                    unqlite_int64 nDataLen,int is_append)

{
  ushort uVar1;
  lhash_kv_engine *plVar2;
  uchar *puVar3;
  unqlite_kv_io *puVar4;
  _func_int *p_Var5;
  SyMemBlock *pSVar6;
  short sVar7;
  sxu16 sVar8;
  sxu64 sVar9;
  unqlite_kv_engine *puVar10;
  sxu32 nKeyLen_00;
  unqlite_kv_engine *puVar11;
  void *pChunk;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong *puVar16;
  lhcell *plVar17;
  lhpage *plVar18;
  ulong uVar19;
  SyMutexMethods *pSVar20;
  lhash_bmap_rec *plVar21;
  ulong uVar22;
  uchar *puVar23;
  SyMemBackend *pSVar24;
  ulong uVar25;
  sxu32 sVar26;
  unqlite_kv_engine *puVar27;
  _func_void **pp_Var28;
  pgno pVar29;
  lhcell *plVar30;
  unqlite_page *pNew;
  unqlite_page *pRaw;
  lhpage *pPage;
  unqlite_page *pNew_1;
  SyMemBackend *local_b0;
  lhcell *local_a8;
  ulong local_a0;
  unqlite_kv_engine *local_98;
  unqlite_kv_engine *local_90;
  unqlite_kv_engine *local_88;
  SyBlob local_80;
  lhpage *local_60;
  lhpage *local_58;
  SyMemBackend *local_50;
  lhpage *local_48;
  SyMemBackend *local_40;
  SyMemBackend *local_38;
  
  uVar25 = nDataLen;
  iVar12 = (*pKv->pIo->xGet)(pKv->pIo->pHandle,1,(unqlite_page **)(pKv + 0x1a));
  if (iVar12 != 0) {
    return iVar12;
  }
  local_58 = (lhpage *)CONCAT44(local_58._4_4_,is_append);
  local_a8 = (lhcell *)pKey;
  local_a0 = nDataLen;
  local_98 = (unqlite_kv_engine *)pData;
  uVar13 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
  local_88 = (unqlite_kv_engine *)(ulong)uVar13;
  uVar19 = (ulong)(*(int *)&pKv[0x26].pIo - 1U & uVar13);
  uVar22 = (ulong)((int)pKv[0x25].pIo - 1U & uVar13);
  if (uVar19 < (ulong)((long)&(pKv[0x25].pIo)->pHandle + (long)&(pKv[0x24].pIo)->pHandle)) {
    uVar22 = uVar19;
  }
  local_90 = (unqlite_kv_engine *)CONCAT44(local_90._4_4_,nKeyLen);
  if (*(int *)&pKv[0x1c].pIo != 0) {
    iVar12 = 0;
    do {
      plVar30 = local_a8;
      puVar16 = (ulong *)(&(pKv[0x1b].pIo)->pHandle)
                         [*(int *)((long)&pKv[0x1c].pIo + 4) - 1U & (uint)uVar22];
      while( true ) {
        if (puVar16 == (ulong *)0x0) goto LAB_00113097;
        if (*puVar16 == uVar22) break;
        puVar16 = (ulong *)puVar16[4];
      }
      iVar14 = lhLoadPage((lhash_kv_engine *)pKv,puVar16[1],(lhpage *)0x0,&local_60,(int)uVar25);
      if (iVar14 != 0) {
        return iVar14;
      }
      (*pKv->pIo->xDontMkHot)(local_60->pRaw);
      nKeyLen_00 = (sxu32)local_90;
      sVar26 = (sxu32)local_88;
      plVar17 = lhFindCell(local_60,plVar30,(sxu32)local_90,sVar26);
      plVar18 = local_60;
      puVar27 = local_98;
      uVar25 = local_a0;
      if (plVar17 != (lhcell *)0x0) {
        plVar18 = plVar17->pPage;
        plVar2 = plVar18->pHash;
        if ((int)local_58 != 0) {
          puVar4 = plVar2->pIo;
          if (CARRY8(plVar17->nData,local_a0)) {
            (*puVar4->xErr)(puVar4->pHandle,"Append operation will cause data overflow");
            iVar14 = -7;
            goto LAB_00113176;
          }
          local_a8 = plVar17;
          iVar14 = (*puVar4->xWrite)(plVar18->pRaw);
          plVar30 = local_a8;
          if (iVar14 != 0) goto LAB_00113176;
          if (local_a8->iOvfl != 0) {
            iVar14 = (*plVar2->pIo->xGet)
                               (plVar2->pIo->pHandle,local_a8->iDataPage,(unqlite_page **)&local_80)
            ;
            if (iVar14 != 0) goto LAB_00113176;
            pSVar20 = (local_80.pAllocator)->pMutexMethods;
            p_Var5 = pSVar20->xGlobalInit;
            pVar29 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
                     ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8
                     | ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
                     ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
            pp_Var28 = (_func_void **)((long)&pSVar20->xGlobalInit + (ulong)plVar30->iDataOfft);
            puVar23 = (uchar *)((long)&pSVar20->xGlobalInit + (long)plVar2->iPageSize);
            uVar13 = plVar2->iPageSize - (uint)plVar30->iDataOfft;
            pSVar24 = local_80.pAllocator;
            uVar25 = plVar30->nData;
            local_58 = plVar18;
            goto LAB_001133f4;
          }
          local_b0 = (SyMemBackend *)((ulong)local_b0 & 0xffffffffffff0000);
          iVar12 = lhAllocateSpace(plVar18,local_a8->nData + uVar25 + (ulong)(local_a8->nKey + 0x1a)
                                   ,(sxu16 *)&local_b0);
          if (iVar12 != 0) {
            puVar23 = plVar18->pRaw->zData;
            iVar14 = lhCellWriteOvflPayload
                               (plVar30,puVar23 + (ulong)plVar30->iStart + 0x1a,plVar30->nKey,
                                puVar23 + (plVar30->iStart + 0x1a + plVar30->nKey),plVar30->nData,
                                puVar27,uVar25,0);
            if (iVar14 != 0) goto LAB_00113176;
            uVar22 = plVar30->nData + uVar25;
            *(ulong *)(plVar18->pRaw->zData + (ulong)plVar30->iStart + 8) =
                 uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                 (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                 (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                 (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38;
            lhRestoreSpace(plVar18,(short)*(undefined4 *)&plVar30->iStart + 0x1a,
                           (short)(int)plVar30->nData + (short)plVar30->nKey);
            plVar30->nData = plVar30->nData + uVar25;
            goto LAB_00113812;
          }
          uVar1 = plVar30->iStart;
          sVar26 = (sxu32)plVar30->nData;
          local_80.pAllocator = &plVar2->sAllocator;
          local_80.pBlob = (void *)0x0;
          local_80.nByte = 0;
          local_80.mByte = 0;
          local_80.nFlags = 0;
          iVar14 = SyBlobAppend(&local_80,
                                plVar18->pRaw->zData + ((uint)uVar1 + plVar30->nKey + 0x1a),sVar26);
          if ((iVar14 == 0) &&
             (iVar14 = SyBlobAppend(&local_80,local_98,(sxu32)local_a0), pChunk = local_80.pBlob,
             plVar30 = local_a8, iVar14 == 0)) {
            lhMoveLocalCell(local_a8,(sxu16)local_b0,local_80.pBlob,local_80._16_8_ & 0xffffffff);
            lhRestoreSpace(plVar18,uVar1,(short)plVar30->nKey + (short)sVar26 + 0x1a);
            if (((local_80.nFlags & 6) == 0) && (local_80.mByte != 0)) {
              SyMemBackendFree(local_80.pAllocator,pChunk);
            }
            goto LAB_00113812;
          }
          if (((local_80.nFlags & 6) == 0) && (local_80.mByte != 0)) {
            SyMemBackendFree(local_80.pAllocator,local_80.pBlob);
          }
          goto LAB_00113176;
        }
        local_a8 = plVar17;
        iVar14 = (*plVar2->pIo->xWrite)(plVar18->pRaw);
        uVar25 = local_a0;
        plVar30 = local_a8;
        if (iVar14 != 0) goto LAB_00113176;
        if (local_a8->iOvfl != 0) {
          iVar14 = (*plVar2->pIo->xGet)
                             (plVar2->pIo->pHandle,local_a8->iDataPage,(unqlite_page **)&local_80);
          if (iVar14 != 0) goto LAB_00113176;
          pSVar20 = (local_80.pAllocator)->pMutexMethods;
          p_Var5 = pSVar20->xGlobalInit;
          pVar29 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
                   ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
                   ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
                   ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
          local_b0 = local_80.pAllocator;
          if (pVar29 == 0) goto LAB_00113233;
          goto LAB_001131e6;
        }
        puVar23 = plVar18->pRaw->zData + (local_a8->nKey + (uint)local_a8->iStart + 0x1a);
        if (local_a8->nData == local_a0) {
          SyMemcpy(puVar27,puVar23,(sxu32)local_a0);
          goto LAB_00113812;
        }
        if (local_a0 < local_a8->nData) {
          SyMemcpy(puVar27,puVar23,(sxu32)local_a0);
          *(ulong *)(plVar18->pRaw->zData + (ulong)plVar30->iStart + 8) =
               uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 |
               (uVar25 & 0xff0000000000) >> 0x18 | (uVar25 & 0xff00000000) >> 8 |
               (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 | (uVar25 & 0xff00) << 0x28
               | uVar25 << 0x38;
          sVar7 = (short)uVar25 + (short)*(undefined4 *)&plVar30->iStart + (short)plVar30->nKey;
          sVar8 = (short)(int)plVar30->nData - (short)uVar25;
        }
        else {
          local_80.pAllocator = (SyMemBackend *)((ulong)local_80.pAllocator & 0xffffffffffff0000);
          iVar12 = lhAllocateSpace(plVar18,(local_a8->nKey + 0x1a) + local_a0,(sxu16 *)&local_80);
          if (iVar12 == 0) {
            sVar8 = plVar30->iStart;
            sVar9 = plVar30->nData;
            lhMoveLocalCell(plVar30,(sxu16)local_80.pAllocator,puVar27,uVar25);
            lhRestoreSpace(plVar18,sVar8,(short)plVar30->nKey + (short)(int)sVar9 + 0x1a);
            goto LAB_00113812;
          }
          iVar14 = lhCellWriteOvflPayload
                             (plVar30,plVar18->pRaw->zData + (ulong)plVar30->iStart + 0x1a,
                              plVar30->nKey,puVar27,uVar25,0);
          if (iVar14 != 0) goto LAB_00113176;
          *(ulong *)(plVar18->pRaw->zData + (ulong)local_a8->iStart + 8) =
               local_a0 >> 0x38 | (local_a0 & 0xff000000000000) >> 0x28 |
               (local_a0 & 0xff0000000000) >> 0x18 | (local_a0 & 0xff00000000) >> 8 |
               (local_a0 & 0xff000000) << 8 | (local_a0 & 0xff0000) << 0x18 |
               (local_a0 & 0xff00) << 0x28 | local_a0 << 0x38;
          sVar8 = (short)(int)local_a8->nData + (short)local_a8->nKey;
          sVar7 = (short)*(undefined4 *)&local_a8->iStart;
          uVar25 = local_a0;
          plVar30 = local_a8;
        }
        lhRestoreSpace(plVar18,sVar7 + 0x1a,sVar8);
        plVar30->nData = uVar25;
        goto LAB_00113812;
      }
      iVar14 = lhStoreCell(local_60,plVar30,nKeyLen_00,local_98,local_a0,sVar26,0);
      if (iVar14 == -0x49) {
        plVar2 = plVar18->pHash;
        iVar14 = -0x18;
        if (plVar2->nBuckRec != 0) {
          for (plVar21 = plVar2->apMap[plVar2->nBuckSize - 1 & (uint)plVar2->split_bucket];
              plVar21 != (lhash_bmap_rec *)0x0; plVar21 = plVar21->pNextCol) {
            if (plVar21->iLogic == plVar2->split_bucket) {
              local_48 = plVar18;
              iVar14 = lhLoadPage(plVar2,plVar21->iReal,(lhpage *)0x0,(lhpage **)&local_80,
                                  (int)uVar25);
              if ((iVar14 != 0) ||
                 (iVar14 = lhAcquirePage(plVar2,(unqlite_page **)&local_b0), iVar14 != 0)) break;
              local_50 = local_b0;
              plVar18 = lhNewPage(plVar2,(unqlite_page *)local_b0,(lhpage *)0x0);
              if (plVar18 == (lhpage *)0x0) {
                iVar14 = -1;
                break;
              }
              iVar14 = lhSetEmptyPage(plVar18);
              if ((iVar14 == 0) &&
                 (iVar14 = lhMapWriteRecord(plVar2,plVar2->max_split_bucket + plVar2->split_bucket,
                                            (pgno)local_50->pBlocks), iVar14 == 0)) {
                local_40 = (SyMemBackend *)local_48->pRaw->iPage;
                local_50 = (SyMemBackend *)(local_80.pAllocator)->pMethods->xFree;
                uVar25 = plVar2->nmax_split_nucket - 1;
                iVar14 = lhPageSplit((lhpage *)(local_80.pAllocator)->pMutexMethods,
                                     (lhpage *)(local_80.pAllocator)->pUserData,(pgno)plVar18,
                                     plVar2->split_bucket);
                if (iVar14 == 0) {
                  plVar2->split_bucket = plVar2->split_bucket + 1;
                  iVar14 = (*plVar2->pIo->xWrite)(plVar2->pHeader);
                  if (iVar14 != 0) break;
                  uVar22 = plVar2->split_bucket;
                  if (uVar22 < plVar2->max_split_bucket) {
                    puVar3 = plVar2->pHeader->zData;
                    puVar23 = puVar3 + 0x10;
                    uVar13 = (uint)uVar22;
                    *(uint *)(puVar3 + 0x14) =
                         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                         uVar13 << 0x18;
                    puVar3[0x13] = (uchar)(uVar22 >> 0x20);
                    puVar3[0x12] = (uchar)(uVar22 >> 0x28);
                    puVar3[0x11] = (uchar)(uVar22 >> 0x30);
                  }
                  else {
                    plVar2->split_bucket = 0;
                    plVar2->max_split_bucket = plVar2->nmax_split_nucket;
                    pVar29 = plVar2->nmax_split_nucket * 2;
                    plVar2->nmax_split_nucket = pVar29;
                    if (pVar29 == 0) {
                      (*plVar2->pIo->xErr)
                                (plVar2->pIo->pHandle,"Database page (64-bit integer) limit reached"
                                );
                      iVar14 = -7;
                      break;
                    }
                    puVar23 = plVar2->pHeader->zData;
                    puVar23[0x10] = '\0';
                    puVar23[0x11] = '\0';
                    puVar23[0x12] = '\0';
                    puVar23[0x13] = '\0';
                    puVar23[0x14] = '\0';
                    puVar23[0x15] = '\0';
                    puVar23[0x16] = '\0';
                    puVar23[0x17] = '\0';
                    uVar22 = plVar2->max_split_bucket;
                    puVar3 = plVar2->pHeader->zData;
                    puVar23 = puVar3 + 0x18;
                    uVar13 = (uint)uVar22;
                    *(uint *)(puVar3 + 0x1c) =
                         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                         uVar13 << 0x18;
                    puVar3[0x1b] = (uchar)(uVar22 >> 0x20);
                    puVar3[0x1a] = (uchar)(uVar22 >> 0x28);
                    puVar3[0x19] = (uchar)(uVar22 >> 0x30);
                  }
                  *puVar23 = (uchar)(uVar22 >> 0x38);
                  sVar26 = (sxu32)local_88;
                  if (local_40 == local_50) goto LAB_00112ee7;
                  uVar25 = local_a0;
                  iVar14 = lhStoreCell(local_48,local_a8,(sxu32)local_90,local_98,local_a0,sVar26,1)
                  ;
                  goto LAB_00112ede;
                }
              }
              (*plVar2->pIo->xPageUnref)(plVar18->pRaw);
              break;
            }
          }
        }
        sVar26 = (sxu32)local_88;
      }
LAB_00112ede:
      if (iVar14 != -0x21) goto LAB_00113176;
LAB_00112ee7:
      if (iVar12 == 2) {
        iVar14 = -0x21;
        goto LAB_00113176;
      }
      iVar12 = iVar12 + 1;
      uVar19 = (ulong)(*(int *)&pKv[0x26].pIo - 1U & sVar26);
      uVar22 = (ulong)((int)pKv[0x25].pIo - 1U & sVar26);
      if (uVar19 < (ulong)((long)&(pKv[0x25].pIo)->pHandle + (long)&(pKv[0x24].pIo)->pHandle)) {
        uVar22 = uVar19;
      }
    } while (*(int *)&pKv[0x1c].pIo != 0);
  }
LAB_00113097:
  plVar30 = local_a8;
  iVar12 = lhAcquirePage((lhash_kv_engine *)pKv,(unqlite_page **)&local_80);
  if (iVar12 != 0) {
    return iVar12;
  }
  local_60 = lhNewPage((lhash_kv_engine *)pKv,(unqlite_page *)local_80.pAllocator,(lhpage *)0x0);
  if (local_60 != (lhpage *)0x0) {
    iVar12 = lhSetEmptyPage(local_60);
    if (iVar12 == 0) {
      iVar12 = lhStoreCell(local_60,plVar30,(sxu32)local_90,local_98,local_a0,(sxu32)local_88,1);
      if (iVar12 == 0) {
        iVar12 = lhMapWriteRecord((lhash_kv_engine *)pKv,uVar22,(pgno)(local_80.pAllocator)->pBlocks
                                 );
      }
    }
    (*pKv->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
    return iVar12;
  }
  return -1;
  while( true ) {
    p_Var5 = local_b0->pMutexMethods->xGlobalInit;
    if (local_b0 != local_80.pAllocator) {
      lhRestorePage(plVar2,(unqlite_page *)local_b0);
      (*plVar2->pIo->xPageUnref)((unqlite_page *)local_b0);
    }
    pVar29 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
             ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
             ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
             ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
    if (pVar29 == 0) break;
LAB_001131e6:
    iVar12 = (*plVar2->pIo->xGet)(plVar2->pIo->pHandle,pVar29,(unqlite_page **)&local_b0);
    if (iVar12 != 0) break;
  }
  pSVar20 = (local_80.pAllocator)->pMutexMethods;
LAB_00113233:
  uVar1 = local_a8->iDataOfft;
  iVar12 = plVar2->iPageSize;
  iVar14 = (*plVar2->pIo->xWrite)((unqlite_page *)local_80.pAllocator);
  if (iVar14 == 0) {
    (local_80.pAllocator)->pMutexMethods->xGlobalInit = (_func_int *)0x0;
    local_58 = plVar18;
    if (0 < (long)local_a0) {
      local_90 = (unqlite_kv_engine *)((long)&local_98->pIo + local_a0);
      pp_Var28 = (_func_void **)((long)&pSVar20->xGlobalInit + (ulong)uVar1);
      puVar27 = (unqlite_kv_engine *)((long)&pSVar20->xGlobalInit + (long)iVar12);
      do {
        if (puVar27 <= pp_Var28) {
          iVar14 = lhAcquirePage(plVar2,(unqlite_page **)&local_38);
          pSVar24 = local_38;
          if ((iVar14 != 0) ||
             (iVar14 = (*plVar2->pIo->xWrite)((unqlite_page *)local_38), iVar14 != 0))
          goto LAB_00113176;
          pSVar6 = pSVar24->pBlocks;
          (local_80.pAllocator)->pMutexMethods->xGlobalInit =
               (_func_int *)
               ((ulong)pSVar6 >> 0x38 | ((ulong)pSVar6 & 0xff000000000000) >> 0x28 |
                ((ulong)pSVar6 & 0xff0000000000) >> 0x18 | ((ulong)pSVar6 & 0xff00000000) >> 8 |
                ((ulong)pSVar6 & 0xff000000) << 8 | ((ulong)pSVar6 & 0xff0000) << 0x18 |
                ((ulong)pSVar6 & 0xff00) << 0x28 | (long)pSVar6 << 0x38);
          (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
          pSVar24->pMutexMethods->xGlobalInit = (_func_int *)0x0;
          local_80.pAllocator = pSVar24;
          pp_Var28 = &pSVar24->pMutexMethods->xGlobalRelease;
          puVar27 = (unqlite_kv_engine *)
                    ((long)&pSVar24->pMutexMethods->xGlobalInit + (long)plVar2->iPageSize);
        }
        puVar11 = local_90;
        puVar10 = local_98;
        uVar15 = (int)puVar27 - (int)pp_Var28;
        uVar13 = (int)local_90 - (int)local_98;
        if (uVar15 <= uVar13) {
          uVar13 = uVar15;
        }
        local_88 = puVar27;
        SyMemcpy(local_98,pp_Var28,uVar13);
        local_98 = (unqlite_kv_engine *)((long)&puVar10->pIo + (ulong)uVar13);
        pp_Var28 = (_func_void **)((long)pp_Var28 + (ulong)uVar13);
        puVar27 = local_88;
      } while (local_98 < puVar11);
    }
    (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
    local_a8->nData = local_a0;
    *(ulong *)(local_58->pRaw->zData + (ulong)local_a8->iStart + 8) =
         local_a0 >> 0x38 | (local_a0 & 0xff000000000000) >> 0x28 |
         (local_a0 & 0xff0000000000) >> 0x18 | (local_a0 & 0xff00000000) >> 8 |
         (local_a0 & 0xff000000) << 8 | (local_a0 & 0xff0000) << 0x18 | (local_a0 & 0xff00) << 0x28
         | local_a0 << 0x38;
LAB_00113812:
    iVar14 = 0;
  }
  goto LAB_00113176;
LAB_001133f4:
  if (puVar23 <= pp_Var28) {
    puVar4 = plVar2->pIo;
    if (pVar29 == 0) {
      (*puVar4->xErr)(puVar4->pHandle,"Corrupt overflow page");
      iVar14 = -0x18;
      goto LAB_00113176;
    }
    iVar14 = (*puVar4->xGet)(puVar4->pHandle,pVar29,(unqlite_page **)&local_b0);
    if (iVar14 != 0) goto LAB_00113176;
    p_Var5 = local_b0->pMutexMethods->xGlobalInit;
    pVar29 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
             ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
             ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
             ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
    (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
    pp_Var28 = &local_b0->pMutexMethods->xGlobalRelease;
    iVar12 = local_a8->pPage->pHash->iPageSize;
    puVar23 = (uchar *)((long)&local_b0->pMutexMethods->xGlobalInit + (long)iVar12);
    uVar13 = iVar12 - 8;
    local_80.pAllocator = local_b0;
    pSVar24 = local_b0;
  }
  uVar22 = (ulong)uVar13;
  if (uVar25 < uVar22) goto LAB_00113645;
  pp_Var28 = (_func_void **)((long)pp_Var28 + uVar22);
  uVar25 = uVar25 - uVar22;
  goto LAB_001133f4;
LAB_00113645:
  iVar14 = (*plVar2->pIo->xWrite)((unqlite_page *)pSVar24);
  if (iVar14 == 0) {
    local_90 = pKv;
    if (0 < (long)local_a0) {
      pp_Var28 = (_func_void **)((long)pp_Var28 + uVar25);
      puVar27 = (unqlite_kv_engine *)((long)&local_98->pIo + local_a0);
      local_88 = puVar27;
      do {
        if (puVar23 <= pp_Var28) {
          iVar14 = lhAcquirePage(plVar2,(unqlite_page **)&local_b0);
          pKv = local_90;
          if ((iVar14 != 0) ||
             (iVar14 = (*plVar2->pIo->xWrite)((unqlite_page *)local_b0), pKv = local_90, iVar14 != 0
             )) goto LAB_00113176;
          pSVar6 = local_b0->pBlocks;
          (local_80.pAllocator)->pMutexMethods->xGlobalInit =
               (_func_int *)
               ((ulong)pSVar6 >> 0x38 | ((ulong)pSVar6 & 0xff000000000000) >> 0x28 |
                ((ulong)pSVar6 & 0xff0000000000) >> 0x18 | ((ulong)pSVar6 & 0xff00000000) >> 8 |
                ((ulong)pSVar6 & 0xff000000) << 8 | ((ulong)pSVar6 & 0xff0000) << 0x18 |
                ((ulong)pSVar6 & 0xff00) << 0x28 | (long)pSVar6 << 0x38);
          (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
          local_b0->pMutexMethods->xGlobalInit = (_func_int *)0x0;
          local_80.pAllocator = local_b0;
          pp_Var28 = &local_b0->pMutexMethods->xGlobalRelease;
          puVar23 = (uchar *)((long)&local_b0->pMutexMethods->xGlobalInit + (long)plVar2->iPageSize)
          ;
        }
        puVar10 = local_98;
        uVar15 = (int)puVar23 - (int)pp_Var28;
        uVar13 = (int)puVar27 - (int)local_98;
        if (uVar15 <= uVar13) {
          uVar13 = uVar15;
        }
        SyMemcpy(local_98,pp_Var28,uVar13);
        local_98 = (unqlite_kv_engine *)((long)&puVar10->pIo + (ulong)uVar13);
        pp_Var28 = (_func_void **)((long)pp_Var28 + (ulong)uVar13);
      } while (local_98 < puVar27);
    }
    (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
    uVar25 = local_a0 + local_a8->nData;
    local_a8->nData = uVar25;
    *(ulong *)(local_58->pRaw->zData + (ulong)local_a8->iStart + 8) =
         uVar25 >> 0x38 | (uVar25 & 0xff000000000000) >> 0x28 | (uVar25 & 0xff0000000000) >> 0x18 |
         (uVar25 & 0xff00000000) >> 8 | (uVar25 & 0xff000000) << 8 | (uVar25 & 0xff0000) << 0x18 |
         (uVar25 & 0xff00) << 0x28 | uVar25 << 0x38;
    iVar14 = 0;
    pKv = local_90;
  }
LAB_00113176:
  (*pKv->pIo->xPageUnref)(local_60->pRaw);
  return iVar14;
}

Assistant:

static int lh_record_insert(
	  unqlite_kv_engine *pKv,         /* KV store */
	  const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	  const void *pData,unqlite_int64 nDataLen, /* Payload: data */
	  int is_append /* True for an append operation */
	  )
{
	lhash_kv_engine *pEngine = (lhash_kv_engine *)pKv;
	lhash_bmap_rec *pRec;
	unqlite_page *pRaw;
	lhpage *pPage;
	lhcell *pCell;
	pgno iBucket;
	sxu32 nHash;
	int iCnt;
	int rc;

	/* Acquire the first page (DB hash Header) so that everything gets loaded automatically */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iCnt = 0;
	/* Compute the hash of the key first */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
retry:
	/* Extract the logical bucket number */
	iBucket = nHash & (pEngine->nmax_split_nucket - 1);
	if( iBucket >= pEngine->split_bucket + pEngine->max_split_bucket ){
		/* Low mask */
		iBucket = nHash & (pEngine->max_split_bucket - 1);
	}
	/* Map the logical bucket number to real page number */
	pRec = lhMapFindBucket(pEngine,iBucket);
	if( pRec == 0 ){
		/* Request a new page */
		rc = lhAcquirePage(pEngine,&pRaw);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initialize the page */
		pPage = lhNewPage(pEngine,pRaw,0);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Mark as an empty page */
		rc = lhSetEmptyPage(pPage);
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pRaw); /* pPage will be released during this call */
			return rc;
		}
		/* Store the cell */
		rc = lhStoreCell(pPage,pKey,nKeyLen,pData,nDataLen,nHash,1);
		if( rc == UNQLITE_OK ){
			/* Install and write the logical map record */
			rc = lhMapWriteRecord(pEngine,iBucket,pRaw->iPage);
		}
		pEngine->pIo->xPageUnref(pRaw);
		return rc;
	}else{
		/* Load the page */
		rc = lhLoadPage(pEngine,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			/* IO error, unlikely scenario */
			return rc;
		}
		/* Do not add this page to the hot dirty list */
		pEngine->pIo->xDontMkHot(pPage->pRaw);
		/* Lookup for the cell */
		pCell = lhFindCell(pPage,pKey,(sxu32)nKeyLen,nHash);
		if( pCell == 0 ){
			/* Create the record */
			rc = lhRecordInstall(pPage,nHash,pKey,nKeyLen,pData,nDataLen);
			if( rc == SXERR_RETRY && iCnt++ < 2 ){
				rc = UNQLITE_OK;
				goto retry;
			}
		}else{
			if( is_append ){
				/* Append operation */
				rc = lhRecordAppend(pCell,pData,nDataLen);
			}else{
				/* Overwrite old value */
				rc = lhRecordOverwrite(pCell,pData,nDataLen);
			}
		}
		pEngine->pIo->xPageUnref(pPage->pRaw);
	}
	return rc;
}